

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_bind_replace.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
BindReplaceDemoFun2::BindReplace
          (BindReplaceDemoFun2 *this,ClientContext *context,TableFunctionBindInput *input)

{
  long *plVar1;
  long *plVar2;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> _Var3;
  long *plVar4;
  long lVar5;
  ConstantExpression *pCVar6;
  TableFunctionRef *this_00;
  pointer pTVar7;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  templated_unique_single_t tf_ref;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_c0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_b8;
  long *local_a0 [8];
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_60 [8];
  
  plVar4 = (long *)operator_new(0x28);
  *plVar4 = 0;
  plVar4[1] = 0;
  plVar4[2] = 0;
  plVar4[3] = 0;
  plVar4[4] = 0;
  *plVar4 = (long)&PTR__TableFunctionData_005d2740;
  *(undefined1 *)(plVar4 + 4) = 0;
  duckdb::vector<duckdb::Value,_true>::operator[](*(vector<duckdb::Value,_true> **)input,0);
  lVar5 = duckdb::Value::GetValue<long>();
  if (lVar5 < 0) {
    *(undefined8 *)this = 0;
  }
  else {
    local_b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duckdb::Value::Value((Value *)local_a0,lVar5);
    pCVar6 = (ConstantExpression *)operator_new(0x78);
    duckdb::Value::Value((Value *)local_60,(Value *)local_a0);
    duckdb::ConstantExpression::ConstantExpression(pCVar6,(Value *)local_60);
    duckdb::Value::~Value((Value *)local_60);
    local_c0._M_head_impl = (ParsedExpression *)pCVar6;
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_b8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_c0);
    if (local_c0._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
    local_c0._M_head_impl = (ParsedExpression *)0x0;
    duckdb::Value::~Value((Value *)local_a0);
    this_00 = (TableFunctionRef *)operator_new(0x78);
    duckdb::TableFunctionRef::TableFunctionRef(this_00);
    local_60[0]._M_head_impl = this_00;
    duckdb::
    make_uniq<duckdb::FunctionExpression,char_const(&)[6],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)local_a0,(char (*) [6])0x4dacae,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_b8);
    plVar2 = local_a0[0];
    local_a0[0] = (long *)0x0;
    pTVar7 = duckdb::
             unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)local_60);
    plVar1 = *(long **)(pTVar7 + 0x68);
    *(long **)(pTVar7 + 0x68) = plVar2;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (local_a0[0] != (long *)0x0) {
      (**(code **)(*local_a0[0] + 8))();
    }
    _Var3._M_head_impl = local_60[0]._M_head_impl;
    local_60[0]._M_head_impl = (TableFunctionRef *)0x0;
    *(TableFunctionRef **)this = _Var3._M_head_impl;
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_b8);
  }
  (**(code **)(*plVar4 + 8))(plVar4);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

static duckdb::unique_ptr<TableRef> BindReplace(ClientContext &context, TableFunctionBindInput &input) {
		auto result = make_uniq<BindReplaceDemoFun2::CustomFunctionData>();

		auto value = input.inputs[0].GetValue<int64_t>();
		if (value < 0) {
			// Note: we are returning a nullptr in a table function without bind, this will fail
			return nullptr;
		}

		duckdb::vector<duckdb::unique_ptr<ParsedExpression>> children;
		children.push_back(make_uniq<ConstantExpression>(Value(value)));
		auto tf_ref = make_uniq<TableFunctionRef>();
		tf_ref->function = make_uniq<FunctionExpression>("range", std::move(children));

		return std::move(tf_ref);
	}